

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test::TestBody
          (BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test *this)

{
  bool bVar1;
  ParamType_conflict *pPVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_1e0;
  Message local_1d8;
  int64_t local_1d0 [2];
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_4;
  Message local_1a8;
  unsigned_long local_1a0;
  unsigned_long local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_3;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  int local_14c;
  unsigned_long local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_110;
  Message local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_;
  string str;
  Message local_c0;
  int local_b4;
  unsigned_long local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  undefined1 local_88 [8];
  CodedInputStream coded_input;
  ArrayInputStream input;
  int kBlockSizes_case;
  BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test *this_local;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  _DAT_02ac8190 = 0x657220646e6120;
  uRam0000000002ac8197._0_1_ = 'a';
  uRam0000000002ac8197._1_1_ = 'd';
  uRam0000000002ac8197._2_1_ = ' ';
  uRam0000000002ac8197._3_1_ = 'r';
  uRam0000000002ac8197._4_1_ = 'a';
  uRam0000000002ac8197._5_1_ = 'w';
  uRam0000000002ac8197._6_1_ = '.';
  uRam0000000002ac8197._7_1_ = '\0';
  DAT_02ac8180 = ' ';
  DAT_02ac8180_1._0_1_ = 'w';
  DAT_02ac8180_1._1_1_ = 'i';
  DAT_02ac8180_1._2_1_ = 'l';
  DAT_02ac8180_1._3_1_ = 'l';
  DAT_02ac8180_1._4_1_ = ' ';
  DAT_02ac8180_1._5_1_ = 'b';
  DAT_02ac8180_1._6_1_ = 'e';
  uRam0000000002ac8188 = 0x65747469727720;
  DAT_02ac818f = 0x6e;
  io::(anonymous_namespace)::CodedStreamTest::buffer_ = 'S';
  DAT_02ac8171 = 'o';
  DAT_02ac8172 = 'm';
  DAT_02ac8173 = 'e';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._3_1_ = ' ';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._4_1_ = 'b';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._5_1_ = 'y';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._6_1_ = 't';
  DAT_02ac8178 = 'e';
  DAT_02ac8178_1._0_1_ = 's';
  DAT_02ac8178_1._1_1_ = ' ';
  DAT_02ac8178_1._2_1_ = 'w';
  DAT_02ac8178_1._3_1_ = 'h';
  DAT_02ac8178_1._4_1_ = 'i';
  DAT_02ac8178_1._5_1_ = 'c';
  DAT_02ac8178_1._6_1_ = 'h';
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&coded_input.extension_factory_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*pPVar2);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_88,(ZeroCopyInputStream *)&coded_input.extension_factory_);
  CodedInputStream::SetTotalBytesLimit((CodedInputStream *)local_88,0x2f);
  local_b0 = 0x2f;
  local_b4 = CodedInputStream::BytesUntilTotalBytesLimit((CodedInputStream *)local_88);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a8,"sizeof(kRawBytes)","coded_input.BytesUntilTotalBytesLimit()",
             &local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x32d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&str.field_2 + 8),&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str.field_2 + 8));
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_f9 = CodedInputStream::ReadString
                       ((CodedInputStream *)local_88,(string *)&gtest_ar_.message_,0x2e);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_f8,
               (AssertionResult *)"coded_input.ReadString(&str, strlen(kRawBytes))","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x330,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_148 = 1;
  local_14c = CodedInputStream::BytesUntilTotalBytesLimit((CodedInputStream *)local_88);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_140,"sizeof(kRawBytes) - strlen(kRawBytes)",
             "coded_input.BytesUntilTotalBytesLimit()",&local_148,&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x332,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  testing::internal::EqHelper::
  Compare<char[47],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_170,"kRawBytes","str",
             (char (*) [47])"Some bytes which will be written and read raw.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x333,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_198 = std::__cxx11::string::capacity();
  local_1a0 = 0x2e;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)local_190,"str.capacity()","strlen(kRawBytes)",&local_198,&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x335,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_88);
  local_1d0[1] = 0x2e;
  local_1d0[0] = ArrayInputStream::ByteCount((ArrayInputStream *)&coded_input.extension_factory_);
  testing::internal::EqHelper::Compare<unsigned_long,_long,_nullptr>
            ((EqHelper *)local_1c0,"strlen(kRawBytes)","input.ByteCount()",
             (unsigned_long *)(local_1d0 + 1),local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x338,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_input.extension_factory_);
  return;
}

Assistant:

TEST_P(BlockSizes, ReadStringReservesMemoryOnTotalLimit) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kRawBytes, sizeof(kRawBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);
    coded_input.SetTotalBytesLimit(sizeof(kRawBytes));
    EXPECT_EQ(sizeof(kRawBytes), coded_input.BytesUntilTotalBytesLimit());

    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, strlen(kRawBytes)));
    EXPECT_EQ(sizeof(kRawBytes) - strlen(kRawBytes),
              coded_input.BytesUntilTotalBytesLimit());
    EXPECT_EQ(kRawBytes, str);
    // TODO: Replace with a more meaningful test (see cl/60966023).
    EXPECT_GE(str.capacity(), strlen(kRawBytes));
  }

  EXPECT_EQ(strlen(kRawBytes), input.ByteCount());
}